

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman.c
# Opt level: O2

uint32_t calculate_value(char *raw,size_t *pos,size_t max)

{
  uint32_t uVar1;
  size_t max_00;
  size_t sVar2;
  uint32_t uVar3;
  int iVar4;
  size_t sVar5;
  
  sVar5 = *pos;
  iVar4 = 0;
  while (max_00 = numeral_no(raw[sVar5]), max_00 != 0) {
    uVar3 = ROMAN_VALUE[max_00];
    while( true ) {
      if (sVar5 == 0) goto LAB_001012a6;
      sVar2 = numeral_no(raw[sVar5 - 1]);
      if (max_00 <= sVar2) break;
      *pos = sVar5 - 1;
      uVar1 = calculate_value(raw,pos,max_00);
      uVar3 = uVar3 - uVar1;
      sVar5 = *pos;
    }
    if (max <= sVar2) goto LAB_001012a6;
    sVar5 = sVar5 - 1;
    *pos = sVar5;
    iVar4 = iVar4 + uVar3;
  }
  uVar3 = 0;
LAB_001012a6:
  return uVar3 + iVar4;
}

Assistant:

uint32_t calculate_value(const char* raw, size_t* pos, size_t max) {
  const size_t my_no = numeral_no(raw[*pos]);
  if (my_no == 0) return 0; // ERROR

  uint32_t value = ROMAN_VALUE[my_no];

  while (*pos > 0 && numeral_no(raw[*pos - 1]) < my_no) {
    *pos -= 1;
    value -= calculate_value(raw, pos, my_no);
  }

  if (*pos > 0 && numeral_no(raw[*pos - 1]) < max) {
    *pos -= 1;
    return value + calculate_value(raw, pos, max);
  } else {
    return value;
  }
}